

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffpktp(fitsfile *fptr,char *filename,int *status)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t slen;
  char local_1d8 [4];
  int keytype;
  char newname [75];
  char keyname [75];
  char template [161];
  char local_88 [8];
  char card [81];
  FILE *diskfile;
  int *status_local;
  char *filename_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    register0x00000000 = fopen(filename,"r");
    if (register0x00000000 == (FILE *)0x0) {
      ffpmsg("ffpktp could not open the following template file:");
      ffpmsg(filename);
      *status = 0x68;
      fptr_local._4_4_ = 0x68;
    }
    else {
      while (pcVar2 = fgets(keyname + 0x48,0xa0,stack0xffffffffffffffd0), pcVar2 != (char *)0x0) {
        sVar3 = strlen(keyname + 0x48);
        keyname[sVar3 + 0x47] = '\0';
        iVar1 = ffgthd(keyname + 0x48,local_88,(int *)((long)&slen + 4),status);
        if (0 < iVar1) break;
        strncpy(newname + 0x48,local_88,8);
        keyname[0] = '\0';
        if (slen._4_4_ == -2) {
          strncpy(local_1d8,card + 0x20,8);
          newname[0] = '\0';
          ffmnam(fptr,newname + 0x48,local_1d8,status);
        }
        else if (slen._4_4_ == -1) {
          ffdkey(fptr,newname + 0x48,status);
        }
        else if (slen._4_4_ == 0) {
          ffucrd(fptr,newname + 0x48,local_88,status);
        }
        else {
          if (slen._4_4_ != 1) break;
          ffprec(fptr,local_88,status);
        }
      }
      fclose(stack0xffffffffffffffd0);
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpktp(fitsfile *fptr,       /* I - FITS file pointer       */
           const char *filename, /* I - name of template file   */
           int *status)          /* IO - error status           */
/*
  read keywords from template file and append to the FITS file
*/
{
    FILE *diskfile;
    char card[FLEN_CARD], template[161];
    char keyname[FLEN_KEYWORD], newname[FLEN_KEYWORD];
    int keytype;
    size_t slen;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    diskfile = fopen(filename,"r"); 
    if (!diskfile)          /* couldn't open file */
    {
            ffpmsg("ffpktp could not open the following template file:");
            ffpmsg(filename);
            return(*status = FILE_NOT_OPENED); 
    }

    while (fgets(template, 160, diskfile) )  /* get next template line */
    {
      template[160] = '\0';      /* make sure string is terminated */
      slen = strlen(template);   /* get string length */
      template[slen - 1] = '\0';  /* over write the 'newline' char */

      if (ffgthd(template, card, &keytype, status) > 0) /* parse template */
         break;

      strncpy(keyname, card, 8);
      keyname[8] = '\0';

      if (keytype == -2)            /* rename the card */
      {
         strncpy(newname, &card[40], 8);
         newname[8] = '\0';

         ffmnam(fptr, keyname, newname, status); 
      }
      else if (keytype == -1)      /* delete the card */
      {
         ffdkey(fptr, keyname, status);
      }
      else if (keytype == 0)       /* update the card */
      {
         ffucrd(fptr, keyname, card, status);
      }
      else if (keytype == 1)      /* append the card */
      {
         ffprec(fptr, card, status);
      }
      else    /* END card; stop here */
      {
         break; 
      }
    }

    fclose(diskfile);   /* close the template file */
    return(*status);
}